

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O3

ON__UINT32 __thiscall ON_OutlineFigure::Internal_EstimateFigureSegmentCount(ON_OutlineFigure *this)

{
  ON_OutlineFigurePoint *pOVar1;
  bool bVar2;
  ON__UINT32 OVar3;
  ON__UINT32 OVar4;
  uint uVar5;
  ON_OutlineFigurePoint *this_00;
  Type TVar6;
  Type TVar7;
  ON_OutlineFigurePoint figure_end;
  ON_OutlineFigurePoint local_38;
  
  OVar3 = Internal_FigureEndDex(this,false);
  OVar4 = 0;
  if ((OVar3 != 0) && (OVar4 = 0, OVar3 < (uint)(this->m_points).m_count)) {
    this_00 = (this->m_points).m_a;
    local_38.m_point.y = this_00[OVar3].m_point.y;
    pOVar1 = this_00 + OVar3;
    local_38.m_point_type = pOVar1->m_point_type;
    local_38.m_point_proximity = pOVar1->m_point_proximity;
    local_38.m_figure_index = pOVar1->m_figure_index;
    local_38.m_point.x = (pOVar1->m_point).x;
    bVar2 = ON_OutlineFigurePoint::IsOnFigure(&local_38);
    if ((bVar2) && (local_38.m_point_type == EndFigureClosed)) {
      uVar5 = OVar3 - 1;
      bVar2 = ON_OutlineFigurePoint::IsOnFigure(this_00 + uVar5);
      if (((bVar2) &&
          (bVar2 = ON_2fPoint::operator==(&this_00[uVar5].m_point,&local_38.m_point), bVar2)) &&
         (OVar3 = uVar5, uVar5 == 0)) {
        return 0;
      }
    }
    OVar4 = 0;
    TVar6 = Unset;
    do {
      this_00 = this_00 + 1;
      bVar2 = ON_OutlineFigurePoint::IsOnFigure(this_00);
      TVar7 = TVar6;
      if (bVar2) {
        TVar7 = this_00->m_point_type;
        OVar4 = OVar4 + (TVar7 != TVar6);
      }
      OVar3 = OVar3 - 1;
      TVar6 = TVar7;
    } while (OVar3 != 0);
  }
  return OVar4;
}

Assistant:

ON__UINT32 ON_OutlineFigure::Internal_EstimateFigureSegmentCount() const
{
  ON__UINT32 figure_end_dex = Internal_FigureEndDex(false);
  const ON__UINT32 count = m_points.UnsignedCount();
  if (0 == figure_end_dex || figure_end_dex >= count)
    return 0;

  ON_OutlineFigurePoint::Type point_type = ON_OutlineFigurePoint::Type::Unset;
  const ON_OutlineFigurePoint* a = m_points.Array();
  const ON_OutlineFigurePoint figure_end = a[figure_end_dex];
  if (
    figure_end.IsOnFigure()
    && ON_OutlineFigurePoint::Type::EndFigureClosed == figure_end.m_point_type
    && 0 != a[figure_end_dex - 1].IsOnFigure()
    && a[figure_end_dex - 1].m_point == figure_end.m_point
    )
  {
    // ignore final zero length segment
    figure_end_dex--;
  }

  int segment_count = 0;
  for (ON__UINT32 i = 1; i <= figure_end_dex; i++)
  {
    if (false == a[i].IsOnFigure() || a[i].m_point_type == point_type)
      continue;
    point_type = a[i].m_point_type;
    segment_count++;
  }

  return segment_count;
}